

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cc
# Opt level: O1

void __thiscall
prometheus::Summary::Summary
          (Summary *this,Quantiles *quantiles,milliseconds max_age,int age_buckets)

{
  (this->quantiles_).
  super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (quantiles->
       super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->quantiles_).
  super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (quantiles->
       super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->quantiles_).
  super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (quantiles->
       super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (quantiles->
  super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (quantiles->
  super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (quantiles->
  super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->sum_ = 0.0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->count_ = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  detail::TimeWindowQuantiles::TimeWindowQuantiles
            (&this->quantile_values_,&this->quantiles_,(duration)(max_age.__r * 1000000),age_buckets
            );
  return;
}

Assistant:

Summary::Summary(Quantiles&& quantiles, const std::chrono::milliseconds max_age,
                 const int age_buckets)
    : quantiles_{std::move(quantiles)},
      quantile_values_{quantiles_, max_age, age_buckets} {}